

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void check_conflict(LexState *ls,LHS_assign *lh,expdesc *v)

{
  int iVar1;
  FuncState *fs_00;
  bool bVar2;
  int conflict;
  int extra;
  FuncState *fs;
  expdesc *v_local;
  LHS_assign *lh_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  iVar1 = fs_00->freereg;
  bVar2 = false;
  for (v_local = (expdesc *)lh; v_local != (expdesc *)0x0; v_local = *(expdesc **)v_local) {
    if ((v_local->u).s.info == 9) {
      if (v_local->t == (v->u).s.info) {
        bVar2 = true;
        v_local->t = iVar1;
      }
      if (v_local->f == (v->u).s.info) {
        bVar2 = true;
        v_local->f = iVar1;
      }
    }
  }
  if (bVar2) {
    luaK_codeABC(fs_00,OP_MOVE,fs_00->freereg,(v->u).s.info,0);
    luaK_reserveregs(fs_00,1);
  }
  return;
}

Assistant:

static void check_conflict(LexState*ls,struct LHS_assign*lh,expdesc*v){
FuncState*fs=ls->fs;
int extra=fs->freereg;
int conflict=0;
for(;lh;lh=lh->prev){
if(lh->v.k==VINDEXED){
if(lh->v.u.s.info==v->u.s.info){
conflict=1;
lh->v.u.s.info=extra;
}
if(lh->v.u.s.aux==v->u.s.info){
conflict=1;
lh->v.u.s.aux=extra;
}
}
}
if(conflict){
luaK_codeABC(fs,OP_MOVE,fs->freereg,v->u.s.info,0);
luaK_reserveregs(fs,1);
}
}